

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O0

void ssh2_bpp_free(BinaryPacketProtocol *bpp)

{
  int *s_00;
  ssh2_bpp_state *s;
  BinaryPacketProtocol *bpp_local;
  
  s_00 = &bpp[-2].remote_bugs;
  safefree(*(void **)&bpp[-1].in_pq.pqb.end.on_free_queue);
  ssh2_bpp_free_outgoing_crypto((ssh2_bpp_state *)s_00);
  ssh2_bpp_free_incoming_crypto((ssh2_bpp_state *)s_00);
  safefree(bpp[-1].out_pq.pqb.end.next);
  safefree(s_00);
  return;
}

Assistant:

static void ssh2_bpp_free(BinaryPacketProtocol *bpp)
{
    struct ssh2_bpp_state *s = container_of(bpp, struct ssh2_bpp_state, bpp);
    sfree(s->buf);
    ssh2_bpp_free_outgoing_crypto(s);
    ssh2_bpp_free_incoming_crypto(s);
    sfree(s->pktin);
    sfree(s);
}